

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

shared_ptr<Jupiter::IRC::Client::User> __thiscall
Jupiter::IRC::Client::getUser(Client *this,string_view in_nickname)

{
  bool bVar1;
  pointer pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
  _Var4;
  shared_ptr<Jupiter::IRC::Client::User> sVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
  local_30;
  const_iterator user;
  Client *this_local;
  string_view in_nickname_local;
  
  this_local = (Client *)in_nickname._M_str;
  _Var4._M_cur = (__node_type *)in_nickname._M_len;
  user.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
               )_Var4._M_cur;
  in_nickname_local._M_str = (char *)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::string,std::shared_ptr<Jupiter::IRC::Client::User>,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((unordered_map<std::__cxx11::string,std::shared_ptr<Jupiter::IRC::Client::User>,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Jupiter::IRC::Client::User>>>>
                   *)(_Var4._M_cur[0xb].
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
                      .
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>_>
                      ._M_storage._M_storage.__data + 8),
                  (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>_>_>
              *)((long)&_Var4._M_cur[0xb].
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false>
                        .
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>_>
                        ._M_storage._M_storage + 8));
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<Jupiter::IRC::Client::User>::shared_ptr
              ((shared_ptr<Jupiter::IRC::Client::User> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::User>_>,_false,_false>
                           *)&local_30);
    std::shared_ptr<Jupiter::IRC::Client::User>::shared_ptr
              ((shared_ptr<Jupiter::IRC::Client::User> *)this,&pvVar2->second);
    _Var3._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar5.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::User>)
         sVar5.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::User> Jupiter::IRC::Client::getUser(std::string_view in_nickname) const {
	auto user = m_users.find(JUPITER_WRAP_MAP_KEY(in_nickname));
	if (user != m_users.end()) {
		return user->second;
	}

	return nullptr;
}